

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PaddingLayerParams::MergeFrom
          (PaddingLayerParams *this,PaddingLayerParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  BorderAmounts *pBVar3;
  PaddingLayerParams_PaddingConstant *pPVar4;
  PaddingLayerParams_PaddingReflection *pPVar5;
  PaddingLayerParams_PaddingReplication *pPVar6;
  PaddingLayerParams_PaddingReflection *from_00;
  PaddingLayerParams_PaddingReplication *from_01;
  PaddingLayerParams_PaddingConstant *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x87d1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (PaddingLayerParams *)&_PaddingLayerParams_default_instance_) &&
     (from->paddingamounts_ != (BorderAmounts *)0x0)) {
    if (this->paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar3 = (BorderAmounts *)operator_new(0x30);
      BorderAmounts::BorderAmounts(pBVar3);
      this->paddingamounts_ = pBVar3;
    }
    pBVar3 = from->paddingamounts_;
    if (pBVar3 == (BorderAmounts *)0x0) {
      pBVar3 = (BorderAmounts *)&_BorderAmounts_default_instance_;
    }
    BorderAmounts::MergeFrom(this->paddingamounts_,pBVar3);
  }
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 3) {
    if (this->_oneof_case_[0] != 3) {
      clear_PaddingType(this);
      this->_oneof_case_[0] = 3;
      pPVar6 = (PaddingLayerParams_PaddingReplication *)operator_new(0x18);
      PaddingLayerParams_PaddingReplication::PaddingLayerParams_PaddingReplication(pPVar6);
      (this->PaddingType_).replication_ = pPVar6;
    }
    pPVar6 = (this->PaddingType_).replication_;
    if (from->_oneof_case_[0] == 3) {
      from_01 = (from->PaddingType_).replication_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (PaddingLayerParams_PaddingReplication *)
                &_PaddingLayerParams_PaddingReplication_default_instance_;
    }
    PaddingLayerParams_PaddingReplication::MergeFrom(pPVar6,from_01);
  }
  else if (uVar1 == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_PaddingType(this);
      this->_oneof_case_[0] = 2;
      pPVar5 = (PaddingLayerParams_PaddingReflection *)operator_new(0x18);
      PaddingLayerParams_PaddingReflection::PaddingLayerParams_PaddingReflection(pPVar5);
      (this->PaddingType_).reflection_ = pPVar5;
    }
    pPVar5 = (this->PaddingType_).reflection_;
    if (from->_oneof_case_[0] == 2) {
      from_00 = (from->PaddingType_).reflection_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_00 = (PaddingLayerParams_PaddingReflection *)
                &_PaddingLayerParams_PaddingReflection_default_instance_;
    }
    PaddingLayerParams_PaddingReflection::MergeFrom(pPVar5,from_00);
  }
  else if (uVar1 == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_PaddingType(this);
      this->_oneof_case_[0] = 1;
      pPVar4 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
      PaddingLayerParams_PaddingConstant::PaddingLayerParams_PaddingConstant(pPVar4);
      (this->PaddingType_).constant_ = pPVar4;
    }
    pPVar4 = (this->PaddingType_).constant_;
    if (from->_oneof_case_[0] == 1) {
      from_02 = (from->PaddingType_).constant_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_02 = (PaddingLayerParams_PaddingConstant *)
                &_PaddingLayerParams_PaddingConstant_default_instance_;
    }
    PaddingLayerParams_PaddingConstant::MergeFrom(pPVar4,from_02);
  }
  return;
}

Assistant:

void PaddingLayerParams::MergeFrom(const PaddingLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PaddingLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_paddingamounts()) {
    mutable_paddingamounts()->::CoreML::Specification::BorderAmounts::MergeFrom(from.paddingamounts());
  }
  switch (from.PaddingType_case()) {
    case kConstant: {
      mutable_constant()->::CoreML::Specification::PaddingLayerParams_PaddingConstant::MergeFrom(from.constant());
      break;
    }
    case kReflection: {
      mutable_reflection()->::CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom(from.reflection());
      break;
    }
    case kReplication: {
      mutable_replication()->::CoreML::Specification::PaddingLayerParams_PaddingReplication::MergeFrom(from.replication());
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
}